

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.hpp
# Opt level: O2

LONG CorUnix::CPalSynchronizationManager::ResetLocalSynchLock(CPalThread *pthrCurrent)

{
  int iVar1;
  
  iVar1 = (pthrCurrent->synchronizationInfo).m_lLocalSynchLockCount.m_val;
  if (iVar1 < 0) {
    fprintf(_stderr,"] %s %s:%d","ResetLocalSynchLock",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.hpp"
            ,0x285);
    fprintf(_stderr,"Expression: 0 <= lRet\n");
  }
  else if (iVar1 != 0) {
    (pthrCurrent->synchronizationInfo).m_lLocalSynchLockCount.m_val = 0;
    InternalLeaveCriticalSection(pthrCurrent,(PCRITICAL_SECTION)s_csSynchProcessLock);
    CThreadSynchronizationInfo::RunDeferredThreadConditionSignalings
              (&pthrCurrent->synchronizationInfo);
  }
  return iVar1;
}

Assistant:

static LONG ResetLocalSynchLock(CPalThread * pthrCurrent) 
        {
            LONG lRet = pthrCurrent->synchronizationInfo.m_lLocalSynchLockCount;

            _ASSERTE(0 <= lRet);
            if (0 < lRet)
            {
                pthrCurrent->synchronizationInfo.m_lLocalSynchLockCount = 0;
                InternalLeaveCriticalSection(pthrCurrent, &s_csSynchProcessLock);

#if SYNCHMGR_SUSPENSION_SAFE_CONDITION_SIGNALING && !SYNCHMGR_PIPE_BASED_THREAD_BLOCKING
                pthrCurrent->synchronizationInfo.RunDeferredThreadConditionSignalings();
#endif // SYNCHMGR_SUSPENSION_SAFE_CONDITION_SIGNALING && !SYNCHMGR_PIPE_BASED_THREAD_BLOCKING
            }            
            return lRet;
        }